

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void G_BuildTiccmd(ticcmd_t *cmd)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  BYTE BVar4;
  BYTE BVar5;
  short sVar6;
  bool bVar7;
  float fVar8;
  int iVar9;
  char *it;
  float fVar10;
  float local_48;
  float local_44;
  float joyaxes [5];
  int tspeed;
  ticcmd_t *base;
  int local_20;
  int fly;
  int side;
  int forward;
  int speed;
  int strafe;
  ticcmd_t *cmd_local;
  
  register0x00000000 = I_BaseTiccmd();
  sVar6 = (register0x00000000->ucmd).pitch;
  sVar1 = (register0x00000000->ucmd).yaw;
  (cmd->ucmd).buttons = (register0x00000000->ucmd).buttons;
  (cmd->ucmd).pitch = sVar6;
  (cmd->ucmd).yaw = sVar1;
  sVar6 = (register0x00000000->ucmd).forwardmove;
  sVar1 = (register0x00000000->ucmd).sidemove;
  sVar2 = (register0x00000000->ucmd).upmove;
  (cmd->ucmd).roll = (register0x00000000->ucmd).roll;
  (cmd->ucmd).forwardmove = sVar6;
  (cmd->ucmd).sidemove = sVar1;
  (cmd->ucmd).upmove = sVar2;
  uVar3 = *(undefined2 *)&register0x00000000->field_0x12;
  cmd->consistancy = register0x00000000->consistancy;
  *(undefined2 *)&cmd->field_0x12 = uVar3;
  cmd->consistancy =
       consistancy[consoleplayer]
       [(int)((long)((ulong)(uint)((int)((long)maketic / (long)ticdup) >> 0x1f) << 0x20 |
                    (long)maketic / (long)ticdup & 0xffffffffU) % 0x24)];
  BVar5 = Button_Strafe.bDown;
  BVar4 = Button_Speed.bDown;
  bVar7 = FBoolCVar::operator_cast_to_bool(&cl_run);
  fVar8 = (float)(uint)(BVar4 ^ bVar7);
  base._4_2_ = 0;
  local_20 = 0;
  fly = 0;
  if ((Button_Left.bDown == '\0') && (Button_Right.bDown == '\0')) {
    turnheld = 0;
  }
  else {
    turnheld = ticdup + turnheld;
  }
  if (BVar5 == '\0') {
    joyaxes[3] = fVar8;
    if (turnheld < 6) {
      joyaxes[3] = (float)((int)fVar8 + 2);
    }
    if (Button_Right.bDown != '\0') {
      G_AddViewAngle(angleturn[(int)joyaxes[3]]);
      LocalKeyboardTurner = true;
    }
    if (Button_Left.bDown != '\0') {
      G_AddViewAngle(-angleturn[(int)joyaxes[3]]);
      LocalKeyboardTurner = true;
    }
  }
  else {
    if (Button_Right.bDown != '\0') {
      local_20 = sidemove[(int)fVar8];
    }
    if (Button_Left.bDown != '\0') {
      local_20 = local_20 - sidemove[(int)fVar8];
    }
  }
  if (Button_LookUp.bDown != '\0') {
    G_AddViewPitch(lookspeed[(int)fVar8]);
    LocalKeyboardTurner = true;
  }
  if (Button_LookDown.bDown != '\0') {
    G_AddViewPitch(-lookspeed[(int)fVar8]);
    LocalKeyboardTurner = true;
  }
  if (Button_MoveUp.bDown != '\0') {
    base._4_2_ = (short)flyspeed[(int)fVar8];
  }
  if (Button_MoveDown.bDown != '\0') {
    base._4_2_ = base._4_2_ - (short)flyspeed[(int)fVar8];
  }
  if (Button_Klook.bDown == '\0') {
    if (Button_Forward.bDown != '\0') {
      fly = forwardmove[(int)fVar8];
    }
    if (Button_Back.bDown != '\0') {
      fly = fly - forwardmove[(int)fVar8];
    }
  }
  else {
    if (Button_Forward.bDown != '\0') {
      G_AddViewPitch(lookspeed[(int)fVar8]);
    }
    if (Button_Back.bDown != '\0') {
      G_AddViewPitch(-lookspeed[(int)fVar8]);
    }
  }
  if (Button_MoveRight.bDown != '\0') {
    local_20 = sidemove[(int)fVar8] + local_20;
  }
  if (Button_MoveLeft.bDown != '\0') {
    local_20 = local_20 - sidemove[(int)fVar8];
  }
  if (Button_Attack.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 1;
  }
  if (Button_AltAttack.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x20;
  }
  if (Button_Use.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 2;
  }
  if (Button_Jump.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 4;
  }
  if (Button_Crouch.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 8;
  }
  if (Button_Zoom.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x80;
  }
  if (Button_Reload.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x40;
  }
  if (Button_User1.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x200000;
  }
  if (Button_User2.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x400000;
  }
  if (Button_User3.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x800000;
  }
  if (Button_User4.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x1000000;
  }
  if (Button_Speed.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x100;
  }
  if (Button_Strafe.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x200;
  }
  if (Button_MoveRight.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x400;
  }
  if (Button_MoveLeft.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x800;
  }
  if (Button_LookDown.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x20000;
  }
  if (Button_LookUp.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x10000;
  }
  if (Button_Back.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x1000;
  }
  if (Button_Forward.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x2000;
  }
  if (Button_Right.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x4000;
  }
  if (Button_Left.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x8000;
  }
  if (Button_MoveDown.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x80000;
  }
  if (Button_MoveUp.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x40000;
  }
  if (Button_ShowScores.bDown != '\0') {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x100000;
  }
  I_GetAxes(&local_48);
  if ((Button_Strafe.bDown != '\0') ||
     ((Button_Mlook.bDown != '\0' && (bVar7 = FBoolCVar::operator_cast_to_bool(&lookstrafe), bVar7))
     )) {
    joyaxes[1] = local_48;
    local_48 = 0.0;
  }
  if (Button_Mlook.bDown != '\0') {
    local_44 = joyaxes[0];
    joyaxes[0] = 0.0;
  }
  if ((local_44 != 0.0) || (NAN(local_44))) {
    iVar9 = joyint((double)(local_44 * 2048.0));
    G_AddViewPitch(iVar9);
    LocalKeyboardTurner = true;
  }
  if ((local_48 != 0.0) || (NAN(local_48))) {
    iVar9 = joyint((double)(local_48 * -1280.0));
    G_AddViewAngle(iVar9);
    LocalKeyboardTurner = true;
  }
  iVar9 = joyint((double)((float)sidemove[(int)fVar8] * joyaxes[1]));
  local_20 = local_20 - iVar9;
  iVar9 = joyint((double)(joyaxes[0] * (float)forwardmove[(int)fVar8]));
  fly = iVar9 + fly;
  iVar9 = joyint((double)(joyaxes[2] * 2048.0));
  base._4_2_ = (short)iVar9 + base._4_2_;
  if ((Button_Mlook.bDown == '\0') && (bVar7 = FBoolCVar::operator_cast_to_bool(&freelook), !bVar7))
  {
    fVar8 = (float)mousey;
    fVar10 = FFloatCVar::operator_cast_to_float(&m_forward);
    fly = (int)(fVar8 * fVar10) + fly;
  }
  iVar9 = fly;
  (cmd->ucmd).pitch = (short)((uint)LocalViewPitch >> 0x10);
  if ((SendLand & 1U) != 0) {
    SendLand = false;
    base._4_2_ = -0x8000;
  }
  if ((BVar5 != '\0') || (bVar7 = FBoolCVar::operator_cast_to_bool(&lookstrafe), bVar7)) {
    fVar8 = (float)mousex;
    fVar10 = FFloatCVar::operator_cast_to_float(&m_side);
    local_20 = (int)(fVar8 * fVar10) + local_20;
  }
  mousey = 0;
  mousex = 0;
  bVar7 = fly <= forwardmove[1];
  fly._0_2_ = (short)forwardmove[1];
  sVar6 = (short)fly;
  if (bVar7) {
    fly = iVar9;
    if (iVar9 < -forwardmove[1]) {
      fly = -forwardmove[1];
    }
  }
  if (local_20 <= forwardmove[1]) {
    if (local_20 < -forwardmove[1]) {
      local_20 = -forwardmove[1];
    }
    sVar6 = (short)local_20;
  }
  local_20._0_2_ = sVar6;
  (cmd->ucmd).forwardmove = (cmd->ucmd).forwardmove + (short)fly;
  (cmd->ucmd).sidemove = (cmd->ucmd).sidemove + (short)local_20;
  (cmd->ucmd).yaw = LocalViewAngle._2_2_;
  (cmd->ucmd).upmove = base._4_2_;
  LocalViewAngle = 0;
  LocalViewPitch = 0;
  if ((sendturn180 & 1U) != 0) {
    sendturn180 = false;
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 0x10;
  }
  if ((sendpause & 1U) != 0) {
    sendpause = false;
    Net_WriteByte('\x14');
  }
  if ((sendsave & 1U) != 0) {
    sendsave = false;
    Net_WriteByte('\x15');
    it = FString::operator_cast_to_char_(&savegamefile);
    Net_WriteString(it);
    Net_WriteString(savedescription);
    FString::operator=(&savegamefile,"");
  }
  if (SendItemUse == (AInventory *)0x1) {
    Net_WriteByte('\x12');
    SendItemUse = (AInventory *)0x0;
  }
  else if (SendItemUse != (AInventory *)0x0) {
    Net_WriteByte('\x13');
    Net_WriteLong((SendItemUse->super_AActor).InventoryID);
    SendItemUse = (AInventory *)0x0;
  }
  if (SendItemDrop != (AInventory *)0x0) {
    Net_WriteByte('\"');
    Net_WriteLong((SendItemDrop->super_AActor).InventoryID);
    SendItemDrop = (AInventory *)0x0;
  }
  (cmd->ucmd).forwardmove = (cmd->ucmd).forwardmove << 8;
  (cmd->ucmd).sidemove = (cmd->ucmd).sidemove << 8;
  return;
}

Assistant:

void G_BuildTiccmd (ticcmd_t *cmd)
{
	int 		strafe;
	int 		speed;
	int 		forward;
	int 		side;
	int			fly;

	ticcmd_t	*base;

	base = I_BaseTiccmd (); 			// empty, or external driver
	*cmd = *base;

	cmd->consistancy = consistancy[consoleplayer][(maketic/ticdup)%BACKUPTICS];

	strafe = Button_Strafe.bDown;
	speed = Button_Speed.bDown ^ (int)cl_run;

	forward = side = fly = 0;

	// [RH] only use two stage accelerative turning on the keyboard
	//		and not the joystick, since we treat the joystick as
	//		the analog device it is.
	if (Button_Left.bDown || Button_Right.bDown)
		turnheld += ticdup;
	else
		turnheld = 0;

	// let movement keys cancel each other out
	if (strafe)
	{
		if (Button_Right.bDown)
			side += sidemove[speed];
		if (Button_Left.bDown)
			side -= sidemove[speed];
	}
	else
	{
		int tspeed = speed;

		if (turnheld < SLOWTURNTICS)
			tspeed += 2;		// slow turn
		
		if (Button_Right.bDown)
		{
			G_AddViewAngle (angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
		if (Button_Left.bDown)
		{
			G_AddViewAngle (-angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
	}

	if (Button_LookUp.bDown)
	{
		G_AddViewPitch (lookspeed[speed]);
		LocalKeyboardTurner = true;
	}
	if (Button_LookDown.bDown)
	{
		G_AddViewPitch (-lookspeed[speed]);
		LocalKeyboardTurner = true;
	}

	if (Button_MoveUp.bDown)
		fly += flyspeed[speed];
	if (Button_MoveDown.bDown)
		fly -= flyspeed[speed];

	if (Button_Klook.bDown)
	{
		if (Button_Forward.bDown)
			G_AddViewPitch (lookspeed[speed]);
		if (Button_Back.bDown)
			G_AddViewPitch (-lookspeed[speed]);
	}
	else
	{
		if (Button_Forward.bDown)
			forward += forwardmove[speed];
		if (Button_Back.bDown)
			forward -= forwardmove[speed];
	}

	if (Button_MoveRight.bDown)
		side += sidemove[speed];
	if (Button_MoveLeft.bDown)
		side -= sidemove[speed];

	// buttons
	if (Button_Attack.bDown)		cmd->ucmd.buttons |= BT_ATTACK;
	if (Button_AltAttack.bDown)		cmd->ucmd.buttons |= BT_ALTATTACK;
	if (Button_Use.bDown)			cmd->ucmd.buttons |= BT_USE;
	if (Button_Jump.bDown)			cmd->ucmd.buttons |= BT_JUMP;
	if (Button_Crouch.bDown)		cmd->ucmd.buttons |= BT_CROUCH;
	if (Button_Zoom.bDown)			cmd->ucmd.buttons |= BT_ZOOM;
	if (Button_Reload.bDown)		cmd->ucmd.buttons |= BT_RELOAD;

	if (Button_User1.bDown)			cmd->ucmd.buttons |= BT_USER1;
	if (Button_User2.bDown)			cmd->ucmd.buttons |= BT_USER2;
	if (Button_User3.bDown)			cmd->ucmd.buttons |= BT_USER3;
	if (Button_User4.bDown)			cmd->ucmd.buttons |= BT_USER4;

	if (Button_Speed.bDown)			cmd->ucmd.buttons |= BT_SPEED;
	if (Button_Strafe.bDown)		cmd->ucmd.buttons |= BT_STRAFE;
	if (Button_MoveRight.bDown)		cmd->ucmd.buttons |= BT_MOVERIGHT;
	if (Button_MoveLeft.bDown)		cmd->ucmd.buttons |= BT_MOVELEFT;
	if (Button_LookDown.bDown)		cmd->ucmd.buttons |= BT_LOOKDOWN;
	if (Button_LookUp.bDown)		cmd->ucmd.buttons |= BT_LOOKUP;
	if (Button_Back.bDown)			cmd->ucmd.buttons |= BT_BACK;
	if (Button_Forward.bDown)		cmd->ucmd.buttons |= BT_FORWARD;
	if (Button_Right.bDown)			cmd->ucmd.buttons |= BT_RIGHT;
	if (Button_Left.bDown)			cmd->ucmd.buttons |= BT_LEFT;
	if (Button_MoveDown.bDown)		cmd->ucmd.buttons |= BT_MOVEDOWN;
	if (Button_MoveUp.bDown)		cmd->ucmd.buttons |= BT_MOVEUP;
	if (Button_ShowScores.bDown)	cmd->ucmd.buttons |= BT_SHOWSCORES;

	// Handle joysticks/game controllers.
	float joyaxes[NUM_JOYAXIS];

	I_GetAxes(joyaxes);

	// Remap some axes depending on button state.
	if (Button_Strafe.bDown || (Button_Mlook.bDown && lookstrafe))
	{
		joyaxes[JOYAXIS_Side] = joyaxes[JOYAXIS_Yaw];
		joyaxes[JOYAXIS_Yaw] = 0;
	}
	if (Button_Mlook.bDown)
	{
		joyaxes[JOYAXIS_Pitch] = joyaxes[JOYAXIS_Forward];
		joyaxes[JOYAXIS_Forward] = 0;
	}

	if (joyaxes[JOYAXIS_Pitch] != 0)
	{
		G_AddViewPitch(joyint(joyaxes[JOYAXIS_Pitch] * 2048));
		LocalKeyboardTurner = true;
	}
	if (joyaxes[JOYAXIS_Yaw] != 0)
	{
		G_AddViewAngle(joyint(-1280 * joyaxes[JOYAXIS_Yaw]));
		LocalKeyboardTurner = true;
	}

	side -= joyint(sidemove[speed] * joyaxes[JOYAXIS_Side]);
	forward += joyint(joyaxes[JOYAXIS_Forward] * forwardmove[speed]);
	fly += joyint(joyaxes[JOYAXIS_Up] * 2048);

	// Handle mice.
	if (!Button_Mlook.bDown && !freelook)
	{
		forward += (int)((float)mousey * m_forward);
	}

	cmd->ucmd.pitch = LocalViewPitch >> 16;

	if (SendLand)
	{
		SendLand = false;
		fly = -32768;
	}

	if (strafe || lookstrafe)
		side += (int)((float)mousex * m_side);

	mousex = mousey = 0;

	// Build command.
	if (forward > MAXPLMOVE)
		forward = MAXPLMOVE;
	else if (forward < -MAXPLMOVE)
		forward = -MAXPLMOVE;
	if (side > MAXPLMOVE)
		side = MAXPLMOVE;
	else if (side < -MAXPLMOVE)
		side = -MAXPLMOVE;

	cmd->ucmd.forwardmove += forward;
	cmd->ucmd.sidemove += side;
	cmd->ucmd.yaw = LocalViewAngle >> 16;
	cmd->ucmd.upmove = fly;
	LocalViewAngle = 0;
	LocalViewPitch = 0;

	// special buttons
	if (sendturn180)
	{
		sendturn180 = false;
		cmd->ucmd.buttons |= BT_TURN180;
	}
	if (sendpause)
	{
		sendpause = false;
		Net_WriteByte (DEM_PAUSE);
	}
	if (sendsave)
	{
		sendsave = false;
		Net_WriteByte (DEM_SAVEGAME);
		Net_WriteString (savegamefile);
		Net_WriteString (savedescription);
		savegamefile = "";
	}
	if (SendItemUse == (const AInventory *)1)
	{
		Net_WriteByte (DEM_INVUSEALL);
		SendItemUse = NULL;
	}
	else if (SendItemUse != NULL)
	{
		Net_WriteByte (DEM_INVUSE);
		Net_WriteLong (SendItemUse->InventoryID);
		SendItemUse = NULL;
	}
	if (SendItemDrop != NULL)
	{
		Net_WriteByte (DEM_INVDROP);
		Net_WriteLong (SendItemDrop->InventoryID);
		SendItemDrop = NULL;
	}

	cmd->ucmd.forwardmove <<= 8;
	cmd->ucmd.sidemove <<= 8;
}